

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

UChar32 __thiscall icu_63::RBBISetBuilder::getFirstChar(RBBISetBuilder *this,int32_t category)

{
  RangeDescriptor *pRStack_20;
  UChar32 retVal;
  RangeDescriptor *rlRange;
  int32_t category_local;
  RBBISetBuilder *this_local;
  
  pRStack_20 = this->fRangeList;
  while( true ) {
    if (pRStack_20 == (RangeDescriptor *)0x0) {
      return -1;
    }
    if (pRStack_20->fNum == category) break;
    pRStack_20 = pRStack_20->fNext;
  }
  return pRStack_20->fStartChar;
}

Assistant:

UChar32  RBBISetBuilder::getFirstChar(int32_t category) const {
    RangeDescriptor   *rlRange;
    UChar32            retVal = (UChar32)-1;
    for (rlRange = fRangeList; rlRange!=0; rlRange=rlRange->fNext) {
        if (rlRange->fNum == category) {
            retVal = rlRange->fStartChar;
            break;
        }
    }
    return retVal;
}